

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

char ** acmod_set_attrib(acmod_set_t *acmod_set,acmod_id_t id)

{
  char **ppcStack_28;
  uint32 addr;
  char **attrib_list;
  acmod_id_t id_local;
  acmod_set_t *acmod_set_local;
  
  if (id < acmod_set->n_ci) {
    ppcStack_28 = acmod_set->ci[id].attrib;
  }
  else {
    if (acmod_set->next_id <= id) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
              ,0x35d,"Phone id %u is out of range.\n",(ulong)id);
      return (char **)0x0;
    }
    ppcStack_28 = acmod_set->multi[id - acmod_set->n_ci].attrib;
  }
  if (ppcStack_28 != (char **)0x0) {
    return ppcStack_28;
  }
  __assert_fail("attrib_list",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                ,0x362,"const char **acmod_set_attrib(acmod_set_t *, acmod_id_t)");
}

Assistant:

const char **
acmod_set_attrib(acmod_set_t *acmod_set,
		 acmod_id_t id)
{
    char **attrib_list;
    uint32 addr;

    if (id < acmod_set->n_ci) {
	attrib_list = acmod_set->ci[id].attrib;
    }
    else if (id < acmod_set->next_id) {
	addr = id - acmod_set->n_ci;

	attrib_list = acmod_set->multi[addr].attrib;
    }
    else {
	E_ERROR("Phone id %u is out of range.\n", id);

	return FALSE;
    }

    assert(attrib_list);
    
    return (const char **)attrib_list;
}